

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.h
# Opt level: O2

void __thiscall dynet::RNNStateMachine::transition(RNNStateMachine *this,RNNOp op)

{
  int iVar1;
  RNNOp RVar2;
  
  iVar1 = *(int *)this;
  RVar2 = (RNNOp)this;
  if (iVar1 != 2) {
    if (iVar1 != 1) {
      if (iVar1 != 0) {
        return;
      }
      if (op == new_graph) goto LAB_00142386;
      dynet::RNNStateMachine::failure(RVar2);
    }
    if (op == new_graph) {
      return;
    }
    if (op == start_new_sequence) {
      *(undefined4 *)this = 2;
      return;
    }
    dynet::RNNStateMachine::failure(RVar2);
  }
  if (op - start_new_sequence < 2) {
    return;
  }
  if (op != new_graph) {
    dynet::RNNStateMachine::failure(RVar2);
    return;
  }
LAB_00142386:
  *(undefined4 *)this = 1;
  return;
}

Assistant:

void transition(RNNOp op) {
    switch (q_) {
      case RNNState::CREATED:
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
      case RNNState::GRAPH_READY:
        if (op == RNNOp::new_graph) { break; }
        if (op == RNNOp::start_new_sequence) { q_ = RNNState::READING_INPUT; break; }
        failure(op);
      case RNNState::READING_INPUT:
        if (op == RNNOp::add_input) { break; }
        if (op == RNNOp::start_new_sequence) { break; }
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
    }
  }